

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_a4ae0::CBBTest_Reserve_Test::TestBody(CBBTest_Reserve_Test *this)

{
  bool bVar1;
  int iVar2;
  cbb_st *pcVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_270;
  Message local_268;
  uint local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_228;
  Message local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__4;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  ScopedCBB cbb;
  size_t len;
  uint8_t *ptr;
  uint8_t buf [10];
  CBBTest_Reserve_Test *this_local;
  
  buf._2_8_ = this;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_);
  local_74 = CBB_init_fixed(pcVar3,(uint8_t *)((long)&ptr + 6),10);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_70,&local_74,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_70,
               (AssertionResult *)"CBB_init_fixed(cbb.get(), buf, sizeof(buf))","false","true",in_R9
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4aa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_
                       );
    iVar2 = CBB_reserve(pcVar3,(uint8_t **)&len,0xb);
    local_d1 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d0,&local_d1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_d0,
                 (AssertionResult *)"CBB_reserve(cbb.get(), &ptr, 11)","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4ac,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_);
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_
                       );
    local_11c = CBB_init_fixed(pcVar3,(uint8_t *)((long)&ptr + 6),10);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_118,&local_11c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_118,
                 (AssertionResult *)"CBB_init_fixed(cbb.get(), buf, sizeof(buf))","false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4af,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_128);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          &gtest_ar_.message_);
      local_164 = CBB_reserve(pcVar3,(uint8_t **)&len,10);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_160,&local_164,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_160,
                   (AssertionResult *)"CBB_reserve(cbb.get(), &ptr, 10)","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x4b1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_170);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        testing::internal::EqHelper::Compare<unsigned_char[10],_unsigned_char_*,_nullptr>
                  ((EqHelper *)local_1a8,"buf","ptr",(uchar (*) [10])((long)&ptr + 6),(uchar **)&len
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
        if (!bVar1) {
          testing::Message::Message(&local_1b0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4b2,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__4.message_,&local_1b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
        pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            &gtest_ar_.message_);
        local_1cc = CBB_did_write(pcVar3,5);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1c8,&local_1cc,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
        if (!bVar1) {
          testing::Message::Message(&local_1d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_1c8,
                     (AssertionResult *)"CBB_did_write(cbb.get(), 5)","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4b4,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
          testing::internal::AssertHelper::~AssertHelper(&local_1e0);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_1d8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              &gtest_ar_.message_);
          local_214 = CBB_finish(pcVar3,(uint8_t **)0x0,(size_t *)((long)&cbb.ctx_.u + 0x18));
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_210,&local_214,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
          if (!bVar1) {
            testing::Message::Message(&local_220);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_210,
                       (AssertionResult *)"CBB_finish(cbb.get(), __null, &len)","false","true",in_R9
                      );
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_228,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4b5,pcVar4);
            testing::internal::AssertHelper::operator=(&local_228,&local_220);
            testing::internal::AssertHelper::~AssertHelper(&local_228);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_220);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_25c = 5;
            testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                      ((EqHelper *)local_258,"5u","len",&local_25c,
                       (unsigned_long *)((long)&cbb.ctx_.u + 0x18));
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
            if (!bVar1) {
              testing::Message::Message(&local_268);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
              testing::internal::AssertHelper::AssertHelper
                        (&local_270,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x4b6,pcVar4);
              testing::internal::AssertHelper::operator=(&local_270,&local_268);
              testing::internal::AssertHelper::~AssertHelper(&local_270);
              testing::Message::~Message(&local_268);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(CBBTest, Reserve) {
  uint8_t buf[10];
  uint8_t *ptr;
  size_t len;
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), buf, sizeof(buf)));
  // Too large.
  EXPECT_FALSE(CBB_reserve(cbb.get(), &ptr, 11));

  cbb.Reset();
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), buf, sizeof(buf)));
  // Successfully reserve the entire space.
  ASSERT_TRUE(CBB_reserve(cbb.get(), &ptr, 10));
  EXPECT_EQ(buf, ptr);
  // Advancing under the maximum bytes is legal.
  ASSERT_TRUE(CBB_did_write(cbb.get(), 5));
  ASSERT_TRUE(CBB_finish(cbb.get(), NULL, &len));
  EXPECT_EQ(5u, len);
}